

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

void handle_pp_undef(Context_conflict1 *ctx)

{
  uint uVar1;
  IncludeState *s;
  long lVar2;
  byte bVar3;
  Token TVar4;
  int iVar5;
  byte bVar6;
  Define *pDVar7;
  char *pcVar8;
  byte *pbVar9;
  Define **ppDVar10;
  ulong uVar11;
  byte *__s1;
  Define *pDVar12;
  undefined8 uStack_40;
  byte abStack_38 [8];
  
  s = ctx->include_stack;
  if (s->pushedback == 0) {
    uStack_40 = 0x14bb84;
    TVar4 = preprocessor_lexer(s);
  }
  else {
    s->pushedback = 0;
    TVar4 = s->tokenval;
  }
  if (TVar4 != TOKEN_IDENTIFIER) {
    pcVar8 = "Macro names must be indentifiers";
LAB_0014bc1f:
    failf(ctx,"%s",pcVar8);
    return;
  }
  uVar1 = s->tokenlen;
  lVar2 = -((ulong)(uVar1 + 1) + 0xf & 0xfffffffffffffff0);
  __s1 = abStack_38 + lVar2;
  pcVar8 = s->token;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bbaf;
  memcpy(__s1,pcVar8,(ulong)uVar1);
  __s1[s->tokenlen] = 0;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bbc0;
  iVar5 = require_newline(s);
  if (iVar5 == 0) {
    pcVar8 = "Invalid #undef directive";
    goto LAB_0014bc1f;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bbd3;
  iVar5 = strcmp((char *)__s1,"__FILE__");
  if (iVar5 == 0) {
    if (ctx->file_macro == (Define *)0x0) goto LAB_0014bc6e;
    ppDVar10 = &ctx->file_macro;
  }
  else {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bbe6;
    iVar5 = strcmp((char *)__s1,"__LINE__");
    if ((iVar5 != 0) || (ctx->line_macro == (Define *)0x0)) goto LAB_0014bc6e;
    ppDVar10 = &ctx->line_macro;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bc5c;
  failf(ctx,"undefining \"%s\"",__s1);
  pDVar12 = *ppDVar10;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bc67;
  free_define(ctx,pDVar12);
  *ppDVar10 = (Define *)0x0;
LAB_0014bc6e:
  bVar3 = *__s1;
  if (bVar3 == 0) {
    uVar11 = 5;
  }
  else {
    bVar6 = 5;
    pbVar9 = __s1;
    do {
      pbVar9 = pbVar9 + 1;
      bVar6 = bVar3 ^ bVar6 * '!';
      bVar3 = *pbVar9;
    } while (bVar3 != 0);
    uVar11 = (ulong)bVar6;
  }
  pDVar12 = ctx->define_hashtable[uVar11];
  if (pDVar12 != (Define *)0x0) {
    pcVar8 = pDVar12->identifier;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bcb7;
    iVar5 = strcmp(pcVar8,(char *)__s1);
    if (iVar5 == 0) {
      pDVar7 = (Define *)0x0;
    }
    else {
      do {
        pDVar7 = pDVar12;
        pDVar12 = pDVar7->next;
        if (pDVar12 == (Define *)0x0) {
          return;
        }
        pcVar8 = pDVar12->identifier;
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bcd2;
        iVar5 = strcmp(pcVar8,(char *)__s1);
      } while (iVar5 != 0);
    }
    ppDVar10 = &pDVar7->next;
    if (pDVar7 == (Define *)0x0) {
      ppDVar10 = ctx->define_hashtable + uVar11;
    }
    *ppDVar10 = pDVar12->next;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x14bd07;
    free_define(ctx,pDVar12);
  }
  return;
}

Assistant:

static void handle_pp_undef(Context *ctx)
{
    IncludeState *state = ctx->include_stack;

    if (lexer(state) != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Macro names must be indentifiers");
        return;
    } // if

    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    if (!require_newline(state))
    {
        fail(ctx, "Invalid #undef directive");
        return;
    } // if

    if (strcmp(sym, "__FILE__") == 0)
    {
        if (ctx->file_macro)
        {
            failf(ctx, "undefining \"%s\"", sym);  // !!! FIXME: should be warning.
            free_define(ctx, ctx->file_macro);
            ctx->file_macro = NULL;
        } // if
    } // if
    else if (strcmp(sym, "__LINE__") == 0)
    {
        if (ctx->line_macro)
        {
            failf(ctx, "undefining \"%s\"", sym);  // !!! FIXME: should be warning.
            free_define(ctx, ctx->line_macro);
            ctx->line_macro = NULL;
        } // if
    } // if

    remove_define(ctx, sym);
}